

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadContents(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FormatVersion FVar4;
  char *sz;
  Logger *pLVar5;
  undefined4 extraout_var_00;
  char *message;
  char *local_458 [4];
  aiString v;
  undefined4 extraout_var;
  
  do {
    while( true ) {
      do {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 1);
      bVar1 = IsElement(this,"COLLADA");
      if (bVar1) break;
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[26]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                 (char (*) [26])"Ignoring global element <");
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      std::operator<<((ostream *)&v,(char *)CONCAT44(extraout_var_00,iVar2));
      std::operator<<((ostream *)&v,">.");
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar5,local_458[0]);
      std::__cxx11::string::~string((string *)local_458);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&v);
      SkipElement(this);
    }
    uVar3 = TestAttribute(this,"version");
    if (uVar3 != 0xffffffff) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
      sz = (char *)CONCAT44(extraout_var,iVar2);
      v.length = 0;
      v.data[0] = '\0';
      memset(v.data + 1,0x1b,0x3ff);
      aiString::Set(&v,sz);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
      ::_M_emplace_unique<char_const(&)[26],aiString&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                  *)&this->mAssetMetaData,(char (*) [26])"SourceAsset_FormatVersion",&v);
      if (*sz == '1') {
        if (sz[1] == '.') {
          FVar4 = FV_1_5_n;
          message = "Collada schema version is 1.5.n";
          if (sz[2] != '5') goto LAB_003f72aa;
LAB_003f72d6:
          this->mFormat = FVar4;
          pLVar5 = DefaultLogger::get();
          Logger::debug(pLVar5,message);
        }
        else {
LAB_003f72aa:
          if (sz[1] == '.') {
            FVar4 = FV_1_4_n;
            message = "Collada schema version is 1.4.n";
            if (sz[2] == '4') goto LAB_003f72d6;
          }
          if (sz[1] == '.') {
            FVar4 = FV_1_3_n;
            message = "Collada schema version is 1.3.n";
            if (sz[2] == '3') goto LAB_003f72d6;
          }
        }
      }
    }
    ReadStructure(this);
  } while( true );
}

Assistant:

void ColladaParser::ReadContents()
{
    while (mReader->read())
    {
        // handle the root element "COLLADA"
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("COLLADA"))
            {
                // check for 'version' attribute
                const int attrib = TestAttribute("version");
                if (attrib != -1) {
                    const char* version = mReader->getAttributeValue(attrib);

                    // Store declared format version string
                    aiString v;
                    v.Set(version);
                    mAssetMetaData.emplace(AI_METADATA_SOURCE_FORMAT_VERSION, v );

                    if (!::strncmp(version, "1.5", 3)) {
                        mFormat = FV_1_5_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.5.n");
                    }
                    else if (!::strncmp(version, "1.4", 3)) {
                        mFormat = FV_1_4_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.4.n");
                    }
                    else if (!::strncmp(version, "1.3", 3)) {
                        mFormat = FV_1_3_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.3.n");
                    }
                }

                ReadStructure();
            }
            else
            {
                ASSIMP_LOG_DEBUG_F("Ignoring global element <", mReader->getNodeName(), ">.");
                SkipElement();
            }
        }
        else
        {
            // skip everything else silently
        }
    }
}